

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

size_t __thiscall
Memory::HeapInfo::Check<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
          (HeapInfo *this,bool expectFull,bool expectPending,
          SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *list,
          SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *tail)

{
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  anon_class_16_3_167268d5 fn;
  _func_int **local_18;
  size_t heapBlockCount;
  
  local_18 = (_func_int **)0x0;
  fn._8_8_ = tail;
  fn.heapBlockCount =
       (size_t *)(ulong)(uint)((int)CONCAT71(in_register_00000031,expectFull) * 0x100 + (int)this);
  HeapBlockList::
  ForEach<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::Check<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>(bool,bool,Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>*,Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)CONCAT71(in_register_00000011,expectPending),list,
             (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)&stack0xffffffffffffffe8,fn);
  return (size_t)local_18;
}

Assistant:

size_t
HeapInfo::Check(bool expectFull, bool expectPending, TBlockType * list, TBlockType * tail)
{
    size_t heapBlockCount = 0;
    HeapBlockList::ForEach(list, tail, [&heapBlockCount, expectFull, expectPending](TBlockType * heapBlock)
    {
        heapBlock->Check(expectFull, expectPending);
        heapBlockCount++;
    });
    return heapBlockCount;
}